

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

void place_stairs(chunk_conflict *c,loc grid,wchar_t feat)

{
  bool bVar1;
  _Bool _Var2;
  level_conflict *plVar3;
  bool local_29;
  _Bool up;
  _Bool down;
  level *current;
  wchar_t feat_local;
  chunk_conflict *c_local;
  loc grid_local;
  
  plVar3 = world->levels + player->place;
  bVar1 = true;
  _Var2 = quest_forbid_downstairs((int)player->place);
  local_29 = !_Var2;
  if ((plVar3->up == (char *)0x0) && (_Var2 = mountain_top_possible(plVar3->index), !_Var2)) {
    bVar1 = false;
  }
  if ((plVar3->down == (char *)0x0) && (_Var2 = underworld_possible(plVar3->index), !_Var2)) {
    local_29 = false;
  }
  if ((bVar1) && (local_29)) {
    square_set_feat((chunk *)c,(loc_conflict)grid,feat);
  }
  else if (bVar1) {
    square_set_feat((chunk *)c,(loc_conflict)grid,FEAT_LESS);
  }
  else if (local_29) {
    square_set_feat((chunk *)c,(loc_conflict)grid,FEAT_MORE);
  }
  return;
}

Assistant:

void place_stairs(struct chunk *c, struct loc grid, int feat)
{
	struct level *current = &world->levels[player->place];
	bool down = true, up = true;

	/* Can't leave quest levels */
	if (quest_forbid_downstairs(player->place))
		down = false;

	/* Deal with underworld and mountain top */
	if (!current->up && !mountain_top_possible(current->index)) {
		up = false;
	}
	if (!current->down && !underworld_possible(current->index)) {
		down = false;
	}

	/* Determine up/down if not already done */
	if (up && down) {
		square_set_feat(c, grid, feat);
	} else if (up) {
		square_set_feat(c, grid, FEAT_LESS);
	} else if (down) {
		square_set_feat(c, grid, FEAT_MORE);
	}
}